

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O1

void __thiscall
xray_re::xr_mesh_vbuf::push(xr_mesh_vbuf *this,xr_vbuf *vb,xr_ibuf *ib,fmatrix *xform)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_t sVar4;
  fvector3 *pfVar5;
  uint16_t *puVar6;
  fvector3 *pfVar7;
  size_t sVar8;
  fvector2 *pfVar9;
  finfluence *pfVar10;
  finfluence *pfVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  xr_mesh_vbuf *this_00;
  long lVar19;
  ulong reserved;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  if ((this->super_xr_vbuf).m_signature == 0) {
    if ((this->super_xr_vbuf).super_xr_flexbuf.m_size != 0) {
      __assert_fail("size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x43,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    (this->super_xr_vbuf).m_signature = vb->m_signature;
  }
  reserved = (vb->super_xr_flexbuf).m_size + (this->super_xr_vbuf).super_xr_flexbuf.m_size;
  this_00 = this;
  if (this->m_reserved < reserved) {
    reserve(this,reserved);
  }
  if (((this->super_xr_vbuf).m_signature & 1) != 0) {
    if ((vb->m_signature & 1) == 0) {
      __assert_fail("vb.has_points()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x4a,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    if (xform == (fmatrix *)0x0) {
      sVar4 = (vb->super_xr_flexbuf).m_size;
      if (sVar4 != 0) {
        memmove((this->super_xr_vbuf).m_points + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
                vb->m_points,sVar4 * 0xc);
      }
    }
    else {
      transform_points(this_00,vb->m_points,
                       (this->super_xr_vbuf).m_points +
                       (this->super_xr_vbuf).super_xr_flexbuf.m_size,(vb->super_xr_flexbuf).m_size,
                       xform);
    }
  }
  if (((this->super_xr_vbuf).m_signature & 2) != 0) {
    if ((vb->m_signature & 2) == 0) {
      if (ib == (xr_ibuf *)0x0) {
        __assert_fail("ib",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                      ,0x59,
                      "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                     );
      }
      uVar3 = (ib->super_xr_flexbuf).m_size;
      if (uVar3 != 0) {
        sVar4 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
        pfVar5 = (this->super_xr_vbuf).m_normals;
        uVar20 = 0;
        do {
          puVar6 = ib->m_indices;
          uVar16 = (ulong)puVar6[uVar20];
          uVar17 = (ulong)puVar6[uVar20 + 1];
          uVar15 = (ulong)puVar6[uVar20 + 2];
          pfVar7 = vb->m_points;
          fVar25 = pfVar7[uVar16].field_0.field_0.x;
          fVar27 = pfVar7[uVar16].field_0.field_0.y;
          fVar21 = pfVar7[uVar17].field_0.field_0.x - fVar25;
          fVar22 = pfVar7[uVar17].field_0.field_0.y - fVar27;
          fVar23 = pfVar7[uVar16].field_0.field_0.z;
          fVar26 = pfVar7[uVar17].field_0.field_0.z - fVar23;
          fVar25 = pfVar7[uVar15].field_0.field_0.x - fVar25;
          fVar27 = pfVar7[uVar15].field_0.field_0.y - fVar27;
          fVar23 = pfVar7[uVar15].field_0.field_0.z - fVar23;
          fVar24 = fVar22 * fVar23 - fVar27 * fVar26;
          fVar23 = fVar26 * fVar25 - fVar23 * fVar21;
          fVar27 = fVar27 * fVar21 - fVar25 * fVar22;
          fVar25 = fVar27 * fVar27 + fVar24 * fVar24 + fVar23 * fVar23;
          if (fVar25 < 0.0) {
            fVar25 = sqrtf(fVar25);
          }
          else {
            fVar25 = SQRT(fVar25);
          }
          fVar24 = fVar24 / fVar25;
          fVar23 = fVar23 / fVar25;
          fVar27 = fVar27 / fVar25;
          pfVar5[sVar4 + uVar16].field_0.field_0.x = fVar24;
          pfVar5[sVar4 + uVar16].field_0.field_0.y = fVar23;
          pfVar5[sVar4 + uVar16].field_0.field_0.z = fVar27;
          pfVar5[sVar4 + uVar17].field_0.field_0.x = fVar24;
          pfVar5[sVar4 + uVar17].field_0.field_0.y = fVar23;
          pfVar5[sVar4 + uVar17].field_0.field_0.z = fVar27;
          pfVar5[sVar4 + uVar15].field_0.field_0.x = fVar24;
          pfVar5[sVar4 + uVar15].field_0.field_0.y = fVar23;
          pfVar5[sVar4 + uVar15].field_0.field_0.z = fVar27;
          uVar20 = uVar20 + 3;
        } while (uVar20 < uVar3);
      }
    }
    else {
      sVar4 = (vb->super_xr_flexbuf).m_size;
      if (sVar4 != 0) {
        memmove((this->super_xr_vbuf).m_normals + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
                vb->m_normals,sVar4 * 0xc);
      }
    }
  }
  if (((this->super_xr_vbuf).m_signature & 4) != 0) {
    if ((vb->m_signature & 4) == 0) {
      __assert_fail("vb.has_texcoords()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x68,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    sVar4 = (vb->super_xr_flexbuf).m_size;
    if (sVar4 != 0) {
      memmove((this->super_xr_vbuf).m_texcoords + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
              vb->m_texcoords,sVar4 << 3);
    }
    if ((this->m_tc_fix == true) && (sVar4 = (vb->super_xr_flexbuf).m_size, sVar4 != 0)) {
      sVar8 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
      pfVar9 = (this->super_xr_vbuf).m_texcoords;
      sVar18 = 0;
      do {
        pfVar9[sVar8 + sVar18].field_0.field_0.x = pfVar9[sVar8 + sVar18].field_0.field_0.x * 0.5;
        pfVar9[sVar8 + sVar18].field_0.field_0.y = pfVar9[sVar8 + sVar18].field_0.field_0.y * 0.5;
        sVar18 = sVar18 + 1;
      } while (sVar4 != sVar18);
    }
  }
  if (((this->super_xr_vbuf).m_signature & 0x10) != 0) {
    if ((vb->m_signature & 0x10) == 0) {
      __assert_fail("vb.has_influences()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x72,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    sVar4 = (vb->super_xr_flexbuf).m_size;
    if (sVar4 != 0) {
      sVar8 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
      pfVar10 = (this->super_xr_vbuf).m_influences;
      pfVar11 = vb->m_influences;
      lVar19 = 0;
      do {
        *(undefined4 *)
         ((long)(pfVar10[sVar8].super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>.array
                + 4) + lVar19) =
             *(undefined4 *)
              ((long)((pfVar11->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                      array + 4) + lVar19);
        puVar1 = (undefined8 *)
                 ((long)&(pfVar11->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                         array[0].bone + lVar19);
        uVar12 = *puVar1;
        uVar13 = puVar1[1];
        puVar1 = (undefined8 *)
                 ((long)&(pfVar11->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                         array[2].bone + lVar19);
        uVar14 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&pfVar10[sVar8].
                         super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>.array[2].
                         bone + lVar19);
        *puVar2 = *puVar1;
        puVar2[1] = uVar14;
        puVar1 = (undefined8 *)
                 ((long)&pfVar10[sVar8].
                         super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>.array[0].
                         bone + lVar19);
        *puVar1 = uVar12;
        puVar1[1] = uVar13;
        lVar19 = lVar19 + 0x24;
      } while (sVar4 * 0x24 != lVar19);
    }
  }
  if (((this->super_xr_vbuf).m_signature & 0x20) != 0) {
    if ((vb->m_signature & 0x20) == 0) {
      __assert_fail("vb.has_colors()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x76,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    sVar4 = (vb->super_xr_flexbuf).m_size;
    if (sVar4 != 0) {
      memmove((this->super_xr_vbuf).m_colors + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
              vb->m_colors,sVar4 << 4);
    }
  }
  (this->super_xr_vbuf).super_xr_flexbuf.m_size = reserved;
  return;
}

Assistant:

void xr_mesh_vbuf::push(const xr_vbuf& vb, const xr_ibuf* ib, const fmatrix* xform)
{
	if (signature() == 0) {
		xr_assert(size() == 0);
		set_signature(vb.signature());
	}
	size_t new_size = size() + vb.size();
	if (m_reserved < new_size)
		reserve(new_size);
	if (has_points()) {
		xr_assert(vb.has_points());
		if (xform)
			transform_points(vb.p(), m_points + size(), vb.size(), *xform);
		else
			copy(vb.p(), m_points + size(), vb.size());
	}
	if (has_normals()) {
		if (vb.has_normals()) {
			if (false && xform)
				transform_normals(vb.n(), m_normals + size(), vb.size(), *xform);
			else
				copy(vb.n(), m_normals + size(), vb.size());
		} else {
			// generate fake normals for 1xxx builds.
			// FIXME (maybe): this will not work correctly for the duplicate faces.
			xr_assert(ib);
			fvector3* normals = m_normals + size();
			for (size_t i = 0, num_indices = ib->size(); i < num_indices; i += 3) {
				uint32_t v0 = (*ib)[i + 0];
				uint32_t v1 = (*ib)[i + 1];
				uint32_t v2 = (*ib)[i + 2];
				fvector3 normal;
				normal.calc_normal(vb.p(v0), vb.p(v1), vb.p(v2));
				normals[v0].set(normal);
				normals[v1].set(normal);
				normals[v2].set(normal);
			}
		}
	}
	if (has_texcoords()) {
		xr_assert(vb.has_texcoords());
		copy(vb.tc(), m_texcoords + size(), vb.size());
		if (m_tc_fix) {
			fvector2* uv = m_texcoords + size();
			for (size_t n = vb.size(); n != 0; --n, ++uv)
				uv->mul(0.5f);
		}
	}
	// intentionally ignoring lightmaps here
	if (has_influences()) {
		xr_assert(vb.has_influences());
		copy(vb.w(), m_influences + size(), vb.size());
	}
	if (has_colors()) {
		xr_assert(vb.has_colors());
		copy(vb.c(), m_colors + size(), vb.size());
	}
	set_size(new_size);
}